

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode Curl_connect(Curl_easy *data,_Bool *asyncp,_Bool *protocol_done)

{
  CURLcode CVar1;
  connectdata *in_RAX;
  connectdata *conn;
  
  *asyncp = false;
  conn = in_RAX;
  Curl_free_request_state(data);
  memset(&data->req,0,0x578);
  (data->req).maxdownload = -1;
  CVar1 = create_conn(data,&conn,asyncp);
  if (CVar1 == CURLE_OK) {
    if ((conn->easyq).size != 0) {
      *protocol_done = true;
      goto LAB_003f1bc9;
    }
    if (*asyncp != false) goto LAB_003f1bc9;
    CVar1 = Curl_setup_conn(conn,protocol_done);
  }
  if (CVar1 == CURLE_NO_CONNECTION_AVAILABLE) {
    return CURLE_NO_CONNECTION_AVAILABLE;
  }
  if (conn != (connectdata *)0x0 && CVar1 != CURLE_OK) {
    Curl_disconnect(data,conn,true);
    return CVar1;
  }
  if (CVar1 != CURLE_OK) {
    return CVar1;
  }
LAB_003f1bc9:
  if (data->conn == (connectdata *)0x0) {
    Curl_attach_connnection(data,conn);
  }
  return CURLE_OK;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;
  struct connectdata *conn;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* init the single-transfer specific data */
  Curl_free_request_state(data);
  memset(&data->req, 0, sizeof(struct SingleRequest));
  data->req.maxdownload = -1;

  /* call the stuff that needs to be called */
  result = create_conn(data, &conn, asyncp);

  if(!result) {
    if(CONN_INUSE(conn))
      /* multiplexed */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(conn, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    return result;
  }
  else if(result && conn) {
    /* We're not allowed to return failure with memory left allocated in the
       connectdata struct, free those here */
    Curl_disconnect(data, conn, TRUE);
  }
  else if(!result && !data->conn)
    /* FILE: transfers already have the connection attached */
    Curl_attach_connnection(data, conn);

  return result;
}